

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

void duckdb::DuckDBAPISetting::SetGlobal(DatabaseInstance *db,DBConfig *config,Value *input)

{
  InvalidInputException *this;
  allocator local_59;
  string new_value;
  string local_38;
  
  Value::GetValue<std::__cxx11::string>(&new_value,input);
  if (db == (DatabaseInstance *)0x0) {
    ::std::__cxx11::string::_M_assign((string *)&(config->options).duckdb_api);
    ::std::__cxx11::string::~string((string *)&new_value);
    return;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Cannot change duckdb_api setting while database is running",
             &local_59);
  InvalidInputException::InvalidInputException(this,&local_38);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DuckDBAPISetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	auto new_value = input.GetValue<string>();
	if (db) {
		throw InvalidInputException("Cannot change duckdb_api setting while database is running");
	}
	config.options.duckdb_api = new_value;
}